

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

bool vkt::tessellation::isPatchDiscarded(TessPrimitiveType primitiveType,float *outerLevels)

{
  int iVar1;
  int local_20;
  int i;
  int numOuterLevels;
  float *outerLevels_local;
  TessPrimitiveType primitiveType_local;
  
  iVar1 = numOuterTessellationLevels(primitiveType);
  local_20 = 0;
  while( true ) {
    if (iVar1 <= local_20) {
      return false;
    }
    if (outerLevels[local_20] <= 0.0) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool isPatchDiscarded (const TessPrimitiveType primitiveType, const float* outerLevels)
{
	const int numOuterLevels = numOuterTessellationLevels(primitiveType);
	for (int i = 0; i < numOuterLevels; i++)
		if (outerLevels[i] <= 0.0f)
			return true;
	return false;
}